

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_ifc.cc
# Opt level: O0

vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_> *
__thiscall
hwtest::pgraph::Bitmap::mthds
          (vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
           *__return_storage_ptr__,Bitmap *this)

{
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l;
  SingleMthdTest *this_00;
  result_type rVar1;
  MthdBitmapColor0 *this_01;
  MthdBitmapColor1 *this_02;
  MthdVtxXy *this_03;
  MthdIfcSize *pMVar2;
  MthdBitmapData *this_04;
  allocator<hwtest::pgraph::SingleMthdTest_*> local_183;
  undefined1 local_182;
  allocator local_181;
  string local_180 [38];
  undefined1 local_15a;
  allocator local_159;
  string local_158 [38];
  undefined1 local_132;
  allocator local_131;
  string local_130 [38];
  undefined1 local_10a;
  allocator local_109;
  string local_108 [38];
  undefined1 local_e2;
  allocator local_e1;
  string local_e0 [38];
  undefined1 local_ba;
  allocator local_b9;
  string local_b8 [38];
  undefined1 local_92;
  allocator local_91;
  string local_90 [48];
  SingleMthdTest *local_60;
  MthdBitmapColor0 *local_58;
  MthdBitmapColor1 *local_50;
  MthdVtxXy *local_48;
  MthdIfcSize *local_40;
  MthdIfcSize *local_38;
  MthdBitmapData *local_30;
  iterator local_28;
  size_type local_20;
  Bitmap *local_18;
  Bitmap *this_local;
  
  local_18 = this;
  this_local = (Bitmap *)__return_storage_ptr__;
  this_00 = (SingleMthdTest *)operator_new(0x25950);
  local_92 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"notify",&local_91);
  MthdNotify::SingleMthdTest
            ((MthdNotify *)this_00,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_90,-1,
             (this->super_Class).cls,0x104,1,4);
  local_92 = 0;
  local_60 = this_00;
  this_01 = (MthdBitmapColor0 *)operator_new(0x25950);
  local_ba = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"color0",&local_b9);
  MthdBitmapColor0::SingleMthdTest
            (this_01,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_b8,-1,
             (this->super_Class).cls,0x308,1,4);
  local_ba = 0;
  local_58 = this_01;
  this_02 = (MthdBitmapColor1 *)operator_new(0x25950);
  local_e2 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"color1",&local_e1);
  MthdBitmapColor1::SingleMthdTest
            (this_02,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_e0,-1,
             (this->super_Class).cls,0x30c,1,4);
  local_e2 = 0;
  local_50 = this_02;
  this_03 = (MthdVtxXy *)operator_new(0x25958);
  local_10a = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,"xy",&local_109);
  MthdVtxXy::MthdVtxXy
            (this_03,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_108,-1,
             (this->super_Class).cls,0x310,1,4,0x21);
  local_10a = 0;
  local_48 = this_03;
  pMVar2 = (MthdIfcSize *)operator_new(0x25958);
  local_132 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,"size_out",&local_131);
  MthdIfcSize::MthdIfcSize
            (pMVar2,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_130,-1,
             (this->super_Class).cls,0x314,0x14);
  local_132 = 0;
  local_40 = pMVar2;
  pMVar2 = (MthdIfcSize *)operator_new(0x25958);
  local_15a = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158,"size_in",&local_159);
  MthdIfcSize::MthdIfcSize
            (pMVar2,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_158,-1,
             (this->super_Class).cls,0x318,0x12);
  local_15a = 0;
  local_38 = pMVar2;
  this_04 = (MthdBitmapData *)operator_new(0x25958);
  local_182 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_180,"bitmap_data",&local_181);
  MthdBitmapData::MthdBitmapData
            (this_04,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_180,-1,
             (this->super_Class).cls,0x400,0x20,4,true);
  local_182 = 0;
  local_28 = &local_60;
  local_20 = 7;
  local_30 = this_04;
  std::allocator<hwtest::pgraph::SingleMthdTest_*>::allocator(&local_183);
  __l._M_len = local_20;
  __l._M_array = local_28;
  std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>::
  vector(__return_storage_ptr__,__l,&local_183);
  std::allocator<hwtest::pgraph::SingleMthdTest_*>::~allocator(&local_183);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  return __return_storage_ptr__;
}

Assistant:

std::vector<SingleMthdTest *> Bitmap::mthds() {
	return {
		new MthdNotify(opt, rnd(), "notify", -1, cls, 0x104),
		new MthdBitmapColor0(opt, rnd(), "color0", -1, cls, 0x308),
		new MthdBitmapColor1(opt, rnd(), "color1", -1, cls, 0x30c),
		new MthdVtxXy(opt, rnd(), "xy", -1, cls, 0x310, 1, 4, VTX_FIRST | VTX_IFC),
		new MthdIfcSize(opt, rnd(), "size_out", -1, cls, 0x314, IFC_OUT | IFC_BITMAP),
		new MthdIfcSize(opt, rnd(), "size_in", -1, cls, 0x318, IFC_IN | IFC_BITMAP),
		new MthdBitmapData(opt, rnd(), "bitmap_data", -1, cls, 0x400, 0x20, 4, true),
	};
}